

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O1

bool SpeedAEAD(EVP_AEAD *aead,string *name,size_t ad_len,string *selected)

{
  size_t chunk_len;
  pointer pcVar1;
  pointer puVar2;
  bool bVar3;
  long lVar4;
  pointer puVar5;
  bool bVar6;
  string local_50;
  
  if ((selected->_M_string_length == 0) ||
     (lVar4 = std::__cxx11::string::find((char *)name,(ulong)(selected->_M_dataplus)._M_p,0),
     lVar4 != -1)) {
    puVar2 = g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar6 = g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    if (!bVar6) {
      puVar5 = g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        chunk_len = *puVar5;
        pcVar1 = (name->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
        bVar3 = SpeedAEADChunk(aead,&local_50,chunk_len,ad_len,evp_aead_seal);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          return bVar6;
        }
        puVar5 = puVar5 + 1;
        bVar6 = puVar5 == puVar2;
      } while (!bVar6);
    }
  }
  else {
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

static bool SpeedAEAD(const EVP_AEAD *aead, const std::string &name,
                      size_t ad_len, const std::string &selected) {
  if (!selected.empty() && name.find(selected) == std::string::npos) {
    return true;
  }

  for (size_t chunk_len : g_chunk_lengths) {
    if (!SpeedAEADChunk(aead, name, chunk_len, ad_len, evp_aead_seal)) {
      return false;
    }
  }
  return true;
}